

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kkt.c
# Opt level: O1

void update_KKT_P(csc *KKT,csc *P,c_int *PtoKKT,c_float param1,c_int *Pdiag_idx,c_int Pdiag_n)

{
  c_float *pcVar1;
  c_float *pcVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = P->p[P->n];
  if (0 < lVar3) {
    pcVar1 = P->x;
    pcVar2 = KKT->x;
    lVar4 = 0;
    do {
      pcVar2[PtoKKT[lVar4]] = pcVar1[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
  }
  if (0 < Pdiag_n) {
    pcVar1 = KKT->x;
    lVar3 = 0;
    do {
      pcVar1[PtoKKT[Pdiag_idx[lVar3]]] = pcVar1[PtoKKT[Pdiag_idx[lVar3]]] + param1;
      lVar3 = lVar3 + 1;
    } while (Pdiag_n != lVar3);
  }
  return;
}

Assistant:

void update_KKT_P(csc          *KKT,
                  const csc    *P,
                  const c_int  *PtoKKT,
                  const c_float param1,
                  const c_int  *Pdiag_idx,
                  const c_int   Pdiag_n) {
  c_int i, j; // Iterations

  // Update elements of KKT using P
  for (i = 0; i < P->p[P->n]; i++) {
    KKT->x[PtoKKT[i]] = P->x[i];
  }

  // Update diagonal elements of KKT by adding sigma
  for (i = 0; i < Pdiag_n; i++) {
    j                  = Pdiag_idx[i]; // Extract index of the element on the
                                       // diagonal
    KKT->x[PtoKKT[j]] += param1;
  }
}